

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.hpp
# Opt level: O0

bool __thiscall
myvk::RenderPassState::SubpassDependencyKey::operator<
          (SubpassDependencyKey *this,SubpassDependencyKey *r)

{
  common_comparison_category_t<__detail::__synth3way_t<const_unsigned_int_&,_const_unsigned_int_&>,___detail::__synth3way_t<const_unsigned_int_&,_const_unsigned_int_&>,___detail::__synth3way_t<const_unsigned_int_&,_const_unsigned_int_&>_>
  cVar1;
  bool bVar2;
  uint *in_stack_ffffffffffffffa8;
  tuple<const_unsigned_int_&,_const_unsigned_int_&,_const_unsigned_int_&> *in_stack_ffffffffffffffb0
  ;
  tuple<const_unsigned_int_&,_const_unsigned_int_&,_const_unsigned_int_&> *in_stack_ffffffffffffffb8
  ;
  
  std::tie<unsigned_int_const,unsigned_int_const,unsigned_int_const>
            ((uint *)in_stack_ffffffffffffffb8,(uint *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  std::tie<unsigned_int_const,unsigned_int_const,unsigned_int_const>
            ((uint *)in_stack_ffffffffffffffb8,(uint *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  cVar1 = std::
          operator<=><unsigned_int_const&,unsigned_int_const&,unsigned_int_const&,unsigned_int_const&,unsigned_int_const&,unsigned_int_const&>
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cmp_cat::__unspec::__unspec((__unspec *)&stack0xffffffffffffffb7,(__unspec *)0x0);
  bVar2 = std::operator<(cVar1._M_value);
  return bVar2;
}

Assistant:

inline bool operator<(const SubpassDependencyKey &r) const {
			return std::tie(subpass_from, subpass_to, dependency_flag) <
			       std::tie(r.subpass_from, r.subpass_to, r.dependency_flag);
		}